

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

const_iterator * __thiscall
QMultiHash<int,_int>::constFindImpl<int>
          (const_iterator *__return_storage_ptr__,QMultiHash<int,_int> *this,int *key)

{
  Data *pDVar1;
  Span *pSVar2;
  ulong uVar3;
  Bucket BVar4;
  
  if (this->m_size != 0) {
    uVar3 = (long)*key ^ this->d->seed;
    uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
    uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
    BVar4 = QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::findBucketWithHash<int>
                      (this->d,key,uVar3 >> 0x20 ^ uVar3);
    if ((BVar4.span)->offsets[BVar4.index] != 0xff) {
      pDVar1 = this->d;
      pSVar2 = pDVar1->spans;
      uVar3 = ((ulong)((long)BVar4.span - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | BVar4.index;
      (__return_storage_ptr__->i).d = pDVar1;
      (__return_storage_ptr__->i).bucket = uVar3;
      __return_storage_ptr__->e = (Chain **)0x0;
      if (pDVar1 == (Data *)0x0) {
        return __return_storage_ptr__;
      }
      uVar3 = uVar3 >> 7;
      __return_storage_ptr__->e =
           (Chain **)
           (pSVar2[uVar3].entries[pSVar2[uVar3].offsets[(uint)BVar4.index & 0x7f]].storage.data + 8)
      ;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->i).d = (Data<QHashPrivate::MultiNode<int,_int>_> *)0x0;
  (__return_storage_ptr__->i).bucket = 0;
  __return_storage_ptr__->e = (Chain **)0x0;
  return __return_storage_ptr__;
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return constEnd();
        return const_iterator(it.toIterator(d));
    }